

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

bool __thiscall BasePort::ReadAllBoards(BasePort *this)

{
  size_t *psVar1;
  uint *puVar2;
  uchar *puVar3;
  BoardIO *pBVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ostream *poVar13;
  ulong uVar14;
  bool bVar15;
  ulong uVar16;
  long *local_50 [2];
  long local_40 [2];
  
  iVar9 = (*this->_vptr_BasePort[0x11])();
  if ((char)iVar9 == '\0') {
    poVar13 = this->outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"BasePort::ReadAllBoards: port not initialized",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  else {
    if (this->Protocol_ == PROTOCOL_BC_QRW) {
      iVar9 = (*this->_vptr_BasePort[0x1e])(this);
      return SUB41(iVar9,0);
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ReadAllBoards","");
    iVar9 = (*this->_vptr_BasePort[0x1b])(this,(string *)local_50,(ulong)this->autoReScan);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    uVar16 = (ulong)this->max_board;
    if ((char)iVar9 != '\0') {
      if (uVar16 == 0) {
        bVar15 = true;
        bVar8 = true;
      }
      else {
        psVar1 = &this->ReadErrorCounter_;
        bVar8 = true;
        uVar16 = 0;
        bVar15 = true;
        do {
          if (this->BoardList[uVar16] != (BoardIO *)0x0) {
            puVar3 = this->ReadBufferBroadcast;
            uVar10 = (*this->_vptr_BasePort[0x18])(this);
            uVar11 = (*this->_vptr_BasePort[0x14])(this,4);
            uVar12 = (*this->BoardList[uVar16]->_vptr_BoardIO[1])();
            iVar9 = (*this->_vptr_BasePort[0x26])
                              (this,uVar16 & 0xff,0,puVar3 + (ulong)uVar11 + (ulong)uVar10,
                               (ulong)uVar12);
            bVar7 = SUB41(iVar9,0);
            bVar6 = false;
            if (bVar7 != false) {
              (*this->BoardList[uVar16]->_vptr_BoardIO[2])
                        (this->BoardList[uVar16],puVar3 + (ulong)uVar11 + (ulong)uVar10);
              bVar8 = false;
              bVar6 = bVar15;
            }
            bVar15 = bVar6;
            pBVar4 = this->BoardList[uVar16];
            pBVar4->readValid = bVar7;
            if (bVar7 == false) {
              puVar2 = &pBVar4->numReadErrors;
              *puVar2 = *puVar2 + 1;
              if (*psVar1 == 0) {
                poVar13 = this->outStr;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,"BasePort::ReadAllBoards: read failed on port ",0x2d);
                poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,this->PortNum);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,", board ",8);
                poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
                std::ostream::put((char)poVar13);
                std::ostream::flush();
              }
              sVar5 = *psVar1;
              *psVar1 = sVar5 + 1;
              if (sVar5 + 1 != 10000) goto LAB_0010d262;
              poVar13 = this->outStr;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,"BasePort::ReadAllBoards: read failed on port ",0x2d);
              poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,this->PortNum);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,", board ",8);
              poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13," occurred 10,000 times",0x16);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
              std::ostream::put((char)poVar13);
              std::ostream::flush();
            }
            *psVar1 = 0;
          }
LAB_0010d262:
          uVar16 = uVar16 + 1;
        } while (uVar16 < this->max_board);
      }
      if (!bVar8) {
        return bVar15;
      }
      (*this->_vptr_BasePort[8])(this);
      return bVar15;
    }
    if (uVar16 != 0) {
      uVar14 = 0;
      do {
        pBVar4 = this->BoardList[uVar14];
        if (pBVar4 != (BoardIO *)0x0) {
          pBVar4->readValid = false;
          pBVar4->numReadErrors = pBVar4->numReadErrors + 1;
        }
        uVar14 = uVar14 + 1;
      } while (uVar16 != uVar14);
    }
  }
  (*this->_vptr_BasePort[8])(this);
  return false;
}

Assistant:

bool BasePort::ReadAllBoards(void)
{
    if (!IsOK()) {
        outStr << "BasePort::ReadAllBoards: port not initialized" << std::endl;
        OnNoneRead();
        return false;
    }

    if (Protocol_ == BasePort::PROTOCOL_BC_QRW) {
        return ReadAllBoardsBroadcast();
    }

    if (!CheckFwBusGeneration("ReadAllBoards", autoReScan)) {
        SetReadInvalid();
        OnNoneRead();
        return false;
    }

    bool allOK = true;
    bool noneRead = true;

    bool rtRead = true;
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            quadlet_t *readBuffer = reinterpret_cast<quadlet_t *>(ReadBufferBroadcast + GetReadQuadAlign() + GetPrefixOffset(RD_FW_BDATA));
            bool ret = ReadBlock(board, 0, readBuffer, BoardList[board]->GetReadNumBytes());
            if (ret) {
                BoardList[board]->SetReadData(readBuffer);
                noneRead = false;
            } else {
                allOK = false;
            }
            BoardList[board]->SetReadValid(ret);

            if (ret) {
                ReadErrorCounter_ = 0;
            }
            else {
                if (ReadErrorCounter_ == 0) {
                    outStr << "BasePort::ReadAllBoards: read failed on port "
                           << PortNum << ", board " << board << std::endl;
                }
                ReadErrorCounter_++;
                if (ReadErrorCounter_ == 10000) {
                    outStr << "BasePort::ReadAllBoards: read failed on port "
                           << PortNum << ", board " << board << " occurred 10,000 times" << std::endl;
                    ReadErrorCounter_ = 0;
                }
            }
        }
    }
    if (!rtRead)
        outStr << "BasePort::ReadAllBoards: rtRead is false" << std::endl;

    if (noneRead) {
        OnNoneRead();
    }
    return allOK;
}